

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::EmitTest::init(EmitTest *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  GeometryShaderOutputType GVar5;
  int iVar6;
  VertexEmitterShader *this_00;
  ShaderProgramDeclaration *pSVar7;
  pointer pcVar8;
  ostream *poVar9;
  GeometryShaderOutputType outputType;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  size_type __dnew;
  ContextType local_494;
  ulong local_490;
  string local_488;
  EmitTest *local_468;
  string local_460;
  FragmentSource local_440;
  string local_420;
  VertexSource local_400;
  ShaderProgramDeclaration *local_3e0;
  undefined4 *local_3d8;
  undefined8 local_3d0;
  undefined4 local_3c8;
  undefined4 uStack_3c4;
  FragmentOutput local_3b4;
  VertexAttribute local_3b0;
  VertexAttribute local_388;
  string local_360;
  GeometrySource local_340;
  string local_320;
  string local_300;
  GeometryToFragmentVarying local_2e0;
  VertexToGeometryVarying local_2d8;
  undefined1 local_2d0 [376];
  GeometryShaderDeclaration local_158;
  ShaderProgramDeclaration local_140;
  
  this_00 = (VertexEmitterShader *)operator_new(0x168);
  local_468 = this;
  local_494.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
  iVar6 = local_468->m_emitCountA;
  iVar2 = local_468->m_endCountA;
  local_490 = (ulong)(uint)local_468->m_emitCountB;
  iVar3 = local_468->m_endCountB;
  GVar5 = sglr::rr_util::mapGLGeometryShaderOutputType(local_468->m_outputType);
  (this_00->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_0215f490;
  (this_00->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_0215f4c8;
  (this_00->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_0215f4e0;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  local_388.name._M_dataplus._M_p = (pointer)&local_388.name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_388);
  local_388.type = GENERICVECTYPE_FLOAT;
  pSVar7 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,&local_388);
  local_3d8 = &local_3c8;
  local_3c8 = 0x6f635f61;
  local_3d0 = 7;
  uStack_3c4 = 0x726f6c;
  local_3b0.name._M_dataplus._M_p = (pointer)&local_3b0.name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_3b0);
  local_3b0.type = GENERICVECTYPE_FLOAT;
  pSVar7 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar7,&local_3b0);
  local_2d8.type = GENERICVECTYPE_FLOAT;
  local_2d8.flatshade = false;
  pSVar7 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar7,&local_2d8);
  local_2e0.type = GENERICVECTYPE_FLOAT;
  local_2e0.flatshade = false;
  pSVar7 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar7,&local_2e0);
  local_3b4.type = GENERICVECTYPE_FLOAT;
  pSVar7 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar7,&local_3b4);
  local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
  local_2d0._0_8_ = (_func_int **)0xc9;
  pcVar8 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_420,(ulong)local_2d0);
  uVar4 = local_2d0._0_8_;
  local_420.field_2._M_allocated_capacity = local_2d0._0_8_;
  local_420._M_dataplus._M_p = pcVar8;
  memcpy(pcVar8,
         "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 v_geom_FragColor;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tgl_PointSize = 1.0;\n\tv_geom_FragColor = a_color;\n}\n"
         ,0xc9);
  local_420._M_string_length = uVar4;
  pcVar8[uVar4] = '\0';
  specializeShader(&local_300,&local_420,&local_494);
  local_400.source._M_dataplus._M_p = (pointer)&local_400.source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_300._M_dataplus._M_p,
             local_300._M_dataplus._M_p + local_300._M_string_length);
  pSVar7 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar7,&local_400);
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  local_2d0._0_8_ = (_func_int **)0x9c;
  pcVar8 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_460,(ulong)local_2d0);
  uVar4 = local_2d0._0_8_;
  local_460.field_2._M_allocated_capacity = local_2d0._0_8_;
  local_460._M_dataplus._M_p = pcVar8;
  memcpy(pcVar8,
         "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_frag_FragColor;\nvoid main (void)\n{\n\tfragColor = v_frag_FragColor;\n}\n"
         ,0x9c);
  local_460._M_string_length = uVar4;
  pcVar8[uVar4] = '\0';
  specializeShader(&local_320,&local_460,&local_494);
  local_440.source._M_dataplus._M_p = (pointer)&local_440.source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_440,local_320._M_dataplus._M_p,
             local_320._M_dataplus._M_p + local_320._M_string_length);
  pSVar7 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar7,&local_440);
  iVar12 = (int)local_490 + iVar6;
  local_158.numOutputVertices = (size_t)iVar12;
  local_158.inputType = GEOMETRYSHADERINPUTTYPE_POINTS;
  local_158.numInvocations = 1;
  local_158.outputType = GVar5;
  local_3e0 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar7,&local_158);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2d0,"${GLSL_VERSION_DECL}\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2d0,"${GLSL_EXT_GEOMETRY_SHADER}",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2d0,"layout(points) in;\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d0,"layout(",7);
  Functional::(anonymous_namespace)::outputTypeToGLString_abi_cxx11_
            (&local_488,(_anonymous_namespace_ *)(ulong)GVar5,outputType);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_2d0,local_488._M_dataplus._M_p,local_488._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", max_vertices = ",0x11);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,") out;",6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2d0,
             "in highp vec4 v_geom_FragColor[];\nout highp vec4 v_frag_FragColor;\n\nvoid main (void)\n{\n\tconst highp vec4 position0 = vec4(-0.5,  0.5, 0.0, 0.0);\n\tconst highp vec4 position1 = vec4( 0.0,  0.1, 0.0, 0.0);\n\tconst highp vec4 position2 = vec4( 0.5,  0.5, 0.0, 0.0);\n\tconst highp vec4 position3 = vec4( 0.7, -0.2, 0.0, 0.0);\n\tconst highp vec4 position4 = vec4( 0.2,  0.2, 0.0, 0.0);\n\tconst highp vec4 position5 = vec4( 0.4, -0.3, 0.0, 0.0);\n\n"
             ,0x1b4);
  if (0 < iVar6) {
    iVar12 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2d0,"\tgl_Position = gl_in[0].gl_Position + position",0x2e);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_2d0,iVar12);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,
                 ";\n\tgl_PrimitiveID = gl_PrimitiveIDIn;\n\tv_frag_FragColor = v_geom_FragColor[0];\n\tEmitVertex();\n\n"
                 ,0x5f);
      iVar12 = iVar12 + 1;
    } while (iVar6 != iVar12);
  }
  if (0 < iVar2) {
    iVar12 = iVar2;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2d0,"\tEndPrimitive();\n",0x11);
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
  }
  if (0 < (int)local_490) {
    uVar11 = local_490 & 0xffffffff;
    iVar12 = iVar6;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2d0,"\tgl_Position = gl_in[0].gl_Position + position",0x2e);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_2d0,iVar12);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,
                 ";\n\tgl_PrimitiveID = gl_PrimitiveIDIn;\n\tv_frag_FragColor = v_geom_FragColor[0];\n\tEmitVertex();\n\n"
                 ,0x5f);
      iVar12 = iVar12 + 1;
      uVar10 = (int)uVar11 - 1;
      uVar11 = (ulong)uVar10;
    } while (uVar10 != 0);
  }
  if (0 < iVar3) {
    iVar12 = iVar3;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2d0,"\tEndPrimitive();\n",0x11);
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d0,"}\n",2);
  std::__cxx11::stringbuf::str();
  specializeShader(&local_360,&local_488,&local_494);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d0);
  std::ios_base::~ios_base((ios_base *)(local_2d0 + 0x70));
  paVar1 = &local_340.source.field_2;
  local_340.source._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_340,local_360._M_dataplus._M_p,
             local_360._M_dataplus._M_p + local_360._M_string_length);
  pSVar7 = sglr::pdec::ShaderProgramDeclaration::operator<<(local_3e0,&local_340);
  sglr::ShaderProgram::ShaderProgram((ShaderProgram *)this_00,pSVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.source._M_dataplus._M_p != paVar1) {
    pSVar7 = (ShaderProgramDeclaration *)(local_340.source.field_2._M_allocated_capacity + 1);
    operator_delete(local_340.source._M_dataplus._M_p,(ulong)pSVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    pSVar7 = (ShaderProgramDeclaration *)(local_360.field_2._M_allocated_capacity + 1);
    operator_delete(local_360._M_dataplus._M_p,(ulong)pSVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440.source._M_dataplus._M_p != &local_440.source.field_2) {
    pSVar7 = (ShaderProgramDeclaration *)(local_440.source.field_2._M_allocated_capacity + 1);
    operator_delete(local_440.source._M_dataplus._M_p,(ulong)pSVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    pSVar7 = (ShaderProgramDeclaration *)(local_320.field_2._M_allocated_capacity + 1);
    operator_delete(local_320._M_dataplus._M_p,(ulong)pSVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    pSVar7 = (ShaderProgramDeclaration *)(local_460.field_2._M_allocated_capacity + 1);
    operator_delete(local_460._M_dataplus._M_p,(ulong)pSVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400.source._M_dataplus._M_p != &local_400.source.field_2) {
    pSVar7 = (ShaderProgramDeclaration *)(local_400.source.field_2._M_allocated_capacity + 1);
    operator_delete(local_400.source._M_dataplus._M_p,(ulong)pSVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    pSVar7 = (ShaderProgramDeclaration *)(local_300.field_2._M_allocated_capacity + 1);
    operator_delete(local_300._M_dataplus._M_p,(ulong)pSVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    pSVar7 = (ShaderProgramDeclaration *)(local_420.field_2._M_allocated_capacity + 1);
    operator_delete(local_420._M_dataplus._M_p,(ulong)pSVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.name._M_dataplus._M_p != &local_3b0.name.field_2) {
    pSVar7 = (ShaderProgramDeclaration *)(local_3b0.name.field_2._M_allocated_capacity + 1);
    operator_delete(local_3b0.name._M_dataplus._M_p,(ulong)pSVar7);
  }
  if (local_3d8 != &local_3c8) {
    pSVar7 = (ShaderProgramDeclaration *)(CONCAT44(uStack_3c4,local_3c8) + 1);
    operator_delete(local_3d8,(ulong)pSVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388.name._M_dataplus._M_p != &local_388.name.field_2) {
    pSVar7 = (ShaderProgramDeclaration *)(local_388.name.field_2._M_allocated_capacity + 1);
    operator_delete(local_388.name._M_dataplus._M_p,(ulong)pSVar7);
  }
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (this_00->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_0215f490;
  (this_00->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_0215f4c8;
  (this_00->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_0215f4e0;
  *(int *)&(this_00->super_ShaderProgram).field_0x154 = iVar6;
  this_00->m_endCountA = iVar2;
  this_00->m_emitCountB = (int)local_490;
  this_00->m_endCountB = iVar3;
  local_468->m_program = this_00;
  iVar6 = GeometryShaderRenderTest::init
                    (&local_468->super_GeometryShaderRenderTest,(EVP_PKEY_CTX *)pSVar7);
  return iVar6;
}

Assistant:

void EmitTest::init(void)
{
	m_program = new VertexEmitterShader(m_context.getRenderContext().getType(), m_emitCountA, m_endCountA, m_emitCountB, m_endCountB, sglr::rr_util::mapGLGeometryShaderOutputType(m_outputType));

	GeometryShaderRenderTest::init();
}